

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBBlendRow_C(uint8 *src_argb0,uint8 *src_argb1,uint8 *dst_argb,int width)

{
  uint8 uVar1;
  uint8 uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint32 br_1;
  uint32 bg_1;
  uint32 bb_1;
  uint32 a_1;
  uint32 fr_1;
  uint32 fg_1;
  uint32 fb_1;
  uint32 br;
  uint32 bg;
  uint32 bb;
  uint32 a;
  uint32 fr;
  uint32 fg;
  uint32 fb;
  int x;
  int width_local;
  uint8 *dst_argb_local;
  uint8 *src_argb1_local;
  uint8 *src_argb0_local;
  
  _x = dst_argb;
  dst_argb_local = src_argb1;
  src_argb1_local = src_argb0;
  for (fg = 0; (int)fg < width + -1; fg = fg + 2) {
    uVar1 = src_argb1_local[1];
    uVar2 = src_argb1_local[2];
    uVar5 = (uint)src_argb1_local[3];
    bVar3 = dst_argb_local[1];
    bVar4 = dst_argb_local[2];
    *_x = (char)((0x100 - uVar5) * (uint)*dst_argb_local >> 8) + *src_argb1_local;
    _x[1] = (char)((0x100 - uVar5) * (uint)bVar3 >> 8) + uVar1;
    _x[2] = (char)((0x100 - uVar5) * (uint)bVar4 >> 8) + uVar2;
    _x[3] = 0xff;
    uVar1 = src_argb1_local[5];
    uVar2 = src_argb1_local[6];
    uVar5 = (uint)src_argb1_local[7];
    bVar3 = dst_argb_local[5];
    bVar4 = dst_argb_local[6];
    _x[4] = (char)((0x100 - uVar5) * (uint)dst_argb_local[4] >> 8) + src_argb1_local[4];
    _x[5] = (char)((0x100 - uVar5) * (uint)bVar3 >> 8) + uVar1;
    _x[6] = (char)((0x100 - uVar5) * (uint)bVar4 >> 8) + uVar2;
    _x[7] = 0xff;
    src_argb1_local = src_argb1_local + 8;
    dst_argb_local = dst_argb_local + 8;
    _x = _x + 8;
  }
  if ((width & 1U) != 0) {
    uVar1 = src_argb1_local[1];
    uVar2 = src_argb1_local[2];
    uVar5 = (uint)src_argb1_local[3];
    bVar3 = dst_argb_local[1];
    bVar4 = dst_argb_local[2];
    *_x = (char)((0x100 - uVar5) * (uint)*dst_argb_local >> 8) + *src_argb1_local;
    _x[1] = (char)((0x100 - uVar5) * (uint)bVar3 >> 8) + uVar1;
    _x[2] = (char)((0x100 - uVar5) * (uint)bVar4 >> 8) + uVar2;
    _x[3] = 0xff;
  }
  return;
}

Assistant:

void ARGBBlendRow_C(const uint8* src_argb0,
                    const uint8* src_argb1,
                    uint8* dst_argb,
                    int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint32 fb = src_argb0[0];
    uint32 fg = src_argb0[1];
    uint32 fr = src_argb0[2];
    uint32 a = src_argb0[3];
    uint32 bb = src_argb1[0];
    uint32 bg = src_argb1[1];
    uint32 br = src_argb1[2];
    dst_argb[0] = BLEND(fb, bb, a);
    dst_argb[1] = BLEND(fg, bg, a);
    dst_argb[2] = BLEND(fr, br, a);
    dst_argb[3] = 255u;

    fb = src_argb0[4 + 0];
    fg = src_argb0[4 + 1];
    fr = src_argb0[4 + 2];
    a = src_argb0[4 + 3];
    bb = src_argb1[4 + 0];
    bg = src_argb1[4 + 1];
    br = src_argb1[4 + 2];
    dst_argb[4 + 0] = BLEND(fb, bb, a);
    dst_argb[4 + 1] = BLEND(fg, bg, a);
    dst_argb[4 + 2] = BLEND(fr, br, a);
    dst_argb[4 + 3] = 255u;
    src_argb0 += 8;
    src_argb1 += 8;
    dst_argb += 8;
  }

  if (width & 1) {
    uint32 fb = src_argb0[0];
    uint32 fg = src_argb0[1];
    uint32 fr = src_argb0[2];
    uint32 a = src_argb0[3];
    uint32 bb = src_argb1[0];
    uint32 bg = src_argb1[1];
    uint32 br = src_argb1[2];
    dst_argb[0] = BLEND(fb, bb, a);
    dst_argb[1] = BLEND(fg, bg, a);
    dst_argb[2] = BLEND(fr, br, a);
    dst_argb[3] = 255u;
  }
}